

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s.c
# Opt level: O2

int blake2s_compress(hash_state *md,uchar *buf)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong32 m [16];
  uint local_108 [8];
  uint local_e8 [24];
  int local_88 [22];
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    local_88[lVar2] = *(int *)(buf + lVar2 * 4);
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    local_108[lVar2] = *(uint *)((long)md + lVar2 * 4);
  }
  uVar3 = local_108[0] + local_108[4] + local_88[0];
  uVar1 = (md->sha256).state[6] ^ uVar3 ^ 0x510e527f;
  local_e8[0] = uVar1 >> 0x10 | uVar1 << 0x10;
  uVar1 = local_e8[0] + 0x6a09e667 ^ local_108[4];
  uVar5 = uVar1 >> 0xc | uVar1 << 0x14;
  uVar4 = uVar3 + local_88[1] + uVar5;
  uVar1 = uVar4 ^ local_e8[0];
  uVar3 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[0] = uVar3 + 0x6a09e667 + local_e8[0];
  uVar5 = uVar5 ^ local_e8[0];
  uVar6 = uVar5 >> 7 | uVar5 << 0x19;
  uVar5 = local_108[1] + local_108[5] + local_88[2];
  uVar1 = (md->sha256).state[7] ^ uVar5 ^ 0x9b05688c;
  local_e8[1] = uVar1 >> 0x10 | uVar1 << 0x10;
  uVar1 = local_e8[1] + 0xbb67ae85 ^ local_108[5];
  uVar1 = uVar1 >> 0xc | uVar1 << 0x14;
  uVar7 = uVar5 + local_88[3] + uVar1;
  uVar5 = uVar7 ^ local_e8[1];
  uVar15 = uVar5 >> 8 | uVar5 << 0x18;
  local_e8[1] = uVar15 + 0xbb67ae85 + local_e8[1];
  uVar1 = uVar1 ^ local_e8[1];
  uVar1 = uVar1 >> 7 | uVar1 << 0x19;
  uVar8 = local_108[2] + local_108[6] + local_88[4];
  uVar5 = (md->sha256).curlen ^ uVar8 ^ 0x1f83d9ab;
  local_e8[2] = uVar5 >> 0x10 | uVar5 << 0x10;
  uVar5 = local_e8[2] + 0x3c6ef372 ^ local_108[6];
  uVar5 = uVar5 >> 0xc | uVar5 << 0x14;
  uVar9 = uVar8 + local_88[5] + uVar5;
  uVar8 = uVar9 ^ local_e8[2];
  uVar16 = uVar8 >> 8 | uVar8 << 0x18;
  local_e8[2] = uVar16 + 0x3c6ef372 + local_e8[2];
  uVar5 = uVar5 ^ local_e8[2];
  uVar13 = uVar5 >> 7 | uVar5 << 0x19;
  uVar8 = local_108[3] + local_108[7] + local_88[6];
  uVar5 = (md->blake2s).f[1] ^ uVar8 ^ 0x5be0cd19;
  local_e8[3] = uVar5 >> 0x10 | uVar5 << 0x10;
  uVar5 = local_e8[3] + 0xa54ff53a ^ local_108[7];
  uVar5 = uVar5 >> 0xc | uVar5 << 0x14;
  uVar10 = uVar8 + local_88[7] + uVar5;
  uVar8 = uVar10 ^ local_e8[3];
  uVar8 = uVar8 >> 8 | uVar8 << 0x18;
  local_e8[3] = uVar8 + 0xa54ff53a + local_e8[3];
  uVar5 = uVar5 ^ local_e8[3];
  uVar5 = uVar5 >> 7 | uVar5 << 0x19;
  uVar4 = uVar4 + local_88[8] + uVar1;
  uVar8 = uVar8 ^ uVar4;
  uVar8 = uVar8 >> 0x10 | uVar8 << 0x10;
  local_e8[2] = local_e8[2] + uVar8;
  uVar1 = uVar1 ^ local_e8[2];
  uVar1 = uVar1 >> 0xc | uVar1 << 0x14;
  uVar4 = uVar4 + local_88[9] + uVar1;
  uVar8 = uVar8 ^ uVar4;
  uVar8 = uVar8 >> 8 | uVar8 << 0x18;
  local_e8[2] = local_e8[2] + uVar8;
  uVar1 = uVar1 ^ local_e8[2];
  uVar12 = uVar1 >> 7 | uVar1 << 0x19;
  uVar7 = uVar7 + local_88[10] + uVar13;
  uVar3 = uVar3 ^ uVar7;
  uVar1 = uVar3 >> 0x10 | uVar3 << 0x10;
  local_e8[3] = local_e8[3] + uVar1;
  uVar13 = uVar13 ^ local_e8[3];
  uVar3 = uVar13 >> 0xc | uVar13 << 0x14;
  uVar9 = uVar9 + local_88[0xc] + uVar5;
  uVar15 = uVar15 ^ uVar9;
  uVar7 = uVar7 + local_88[0xb] + uVar3;
  uVar1 = uVar1 ^ uVar7;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[3] = local_e8[3] + uVar1;
  uVar3 = uVar3 ^ local_e8[3];
  uVar14 = uVar3 >> 7 | uVar3 << 0x19;
  uVar13 = uVar15 >> 0x10 | uVar15 << 0x10;
  local_e8[0] = local_e8[0] + uVar13;
  uVar5 = uVar5 ^ local_e8[0];
  uVar3 = uVar5 >> 0xc | uVar5 << 0x14;
  uVar7 = uVar7 + local_88[4] + uVar12;
  uVar9 = uVar9 + local_88[0xd] + uVar3;
  uVar13 = uVar13 ^ uVar9;
  uVar15 = uVar13 >> 8 | uVar13 << 0x18;
  local_e8[0] = local_e8[0] + uVar15;
  uVar15 = uVar15 ^ uVar7;
  uVar3 = uVar3 ^ local_e8[0];
  uVar5 = uVar3 >> 7 | uVar3 << 0x19;
  uVar9 = uVar9 + local_88[9] + uVar14;
  uVar3 = uVar10 + local_88[0xe] + uVar6;
  uVar16 = uVar16 ^ uVar3;
  uVar13 = uVar16 >> 0x10 | uVar16 << 0x10;
  local_e8[1] = local_e8[1] + uVar13;
  uVar6 = uVar6 ^ local_e8[1];
  uVar10 = uVar6 >> 0xc | uVar6 << 0x14;
  uVar6 = uVar3 + local_88[0xf] + uVar10;
  uVar13 = uVar13 ^ uVar6;
  uVar16 = uVar13 >> 8 | uVar13 << 0x18;
  local_e8[1] = local_e8[1] + uVar16;
  uVar16 = uVar16 ^ uVar9;
  uVar10 = uVar10 ^ local_e8[1];
  uVar10 = uVar10 >> 7 | uVar10 << 0x19;
  uVar3 = uVar4 + local_88[0xe] + uVar10;
  uVar1 = uVar1 ^ uVar3;
  uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[0] = local_e8[0] + uVar1;
  uVar10 = uVar10 ^ local_e8[0];
  uVar4 = uVar10 >> 0xc | uVar10 << 0x14;
  uVar10 = uVar6 + local_88[0xd] + uVar5;
  uVar8 = uVar8 ^ uVar10;
  uVar3 = uVar3 + local_88[10] + uVar4;
  uVar1 = uVar1 ^ uVar3;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[0] = local_e8[0] + uVar1;
  uVar4 = uVar4 ^ local_e8[0];
  uVar13 = uVar4 >> 7 | uVar4 << 0x19;
  uVar15 = uVar15 >> 0x10 | uVar15 << 0x10;
  local_e8[1] = local_e8[1] + uVar15;
  uVar12 = uVar12 ^ local_e8[1];
  uVar4 = uVar12 >> 0xc | uVar12 << 0x14;
  uVar6 = uVar7 + local_88[8] + uVar4;
  uVar15 = uVar15 ^ uVar6;
  uVar15 = uVar15 >> 8 | uVar15 << 0x18;
  local_e8[1] = local_e8[1] + uVar15;
  uVar4 = uVar4 ^ local_e8[1];
  uVar12 = uVar4 >> 7 | uVar4 << 0x19;
  uVar16 = uVar16 >> 0x10 | uVar16 << 0x10;
  uVar3 = uVar3 + local_88[1] + uVar12;
  local_e8[2] = local_e8[2] + uVar16;
  uVar14 = uVar14 ^ local_e8[2];
  uVar4 = uVar14 >> 0xc | uVar14 << 0x14;
  uVar7 = uVar9 + local_88[0xf] + uVar4;
  uVar16 = uVar16 ^ uVar7;
  uVar16 = uVar16 >> 8 | uVar16 << 0x18;
  local_e8[2] = local_e8[2] + uVar16;
  uVar4 = uVar4 ^ local_e8[2];
  uVar14 = uVar4 >> 7 | uVar4 << 0x19;
  uVar8 = uVar8 >> 0x10 | uVar8 << 0x10;
  uVar6 = uVar6 + local_88[0] + uVar14;
  uVar1 = uVar1 ^ uVar6;
  local_e8[3] = local_e8[3] + uVar8;
  uVar5 = uVar5 ^ local_e8[3];
  uVar4 = uVar5 >> 0xc | uVar5 << 0x14;
  uVar9 = uVar10 + local_88[6] + uVar4;
  uVar8 = uVar8 ^ uVar9;
  uVar5 = uVar8 >> 8 | uVar8 << 0x18;
  local_e8[3] = local_e8[3] + uVar5;
  uVar5 = uVar5 ^ uVar3;
  uVar4 = uVar4 ^ local_e8[3];
  uVar4 = uVar4 >> 7 | uVar4 << 0x19;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[2] = local_e8[2] + uVar5;
  uVar7 = uVar7 + local_88[0xb] + uVar4;
  uVar12 = uVar12 ^ local_e8[2];
  uVar8 = uVar12 >> 0xc | uVar12 << 0x14;
  uVar15 = uVar15 ^ uVar7;
  uVar3 = uVar3 + local_88[0xc] + uVar8;
  uVar5 = uVar5 ^ uVar3;
  uVar5 = uVar5 >> 8 | uVar5 << 0x18;
  local_e8[2] = local_e8[2] + uVar5;
  uVar8 = uVar8 ^ local_e8[2];
  uVar8 = uVar8 >> 7 | uVar8 << 0x19;
  uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[3] = local_e8[3] + uVar1;
  uVar14 = uVar14 ^ local_e8[3];
  uVar10 = uVar14 >> 0xc | uVar14 << 0x14;
  uVar12 = uVar6 + local_88[2] + uVar10;
  uVar1 = uVar1 ^ uVar12;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[3] = local_e8[3] + uVar1;
  uVar10 = uVar10 ^ local_e8[3];
  uVar14 = uVar10 >> 7 | uVar10 << 0x19;
  uVar10 = uVar15 >> 0x10 | uVar15 << 0x10;
  uVar12 = uVar12 + local_88[0xc] + uVar8;
  local_e8[0] = local_e8[0] + uVar10;
  uVar4 = uVar4 ^ local_e8[0];
  uVar4 = uVar4 >> 0xc | uVar4 << 0x14;
  uVar6 = uVar7 + local_88[7] + uVar4;
  uVar10 = uVar10 ^ uVar6;
  uVar15 = uVar10 >> 8 | uVar10 << 0x18;
  local_e8[0] = local_e8[0] + uVar15;
  uVar15 = uVar15 ^ uVar12;
  uVar4 = uVar4 ^ local_e8[0];
  uVar4 = uVar4 >> 7 | uVar4 << 0x19;
  uVar7 = uVar9 + local_88[5] + uVar13;
  uVar6 = uVar6 + local_88[5] + uVar14;
  uVar16 = uVar16 ^ uVar7;
  uVar10 = uVar16 >> 0x10 | uVar16 << 0x10;
  local_e8[1] = local_e8[1] + uVar10;
  uVar13 = uVar13 ^ local_e8[1];
  uVar9 = uVar13 >> 0xc | uVar13 << 0x14;
  uVar7 = uVar7 + local_88[3] + uVar9;
  uVar10 = uVar10 ^ uVar7;
  uVar16 = uVar10 >> 8 | uVar10 << 0x18;
  local_e8[1] = local_e8[1] + uVar16;
  uVar16 = uVar16 ^ uVar6;
  uVar7 = uVar7 + local_88[0xf] + uVar4;
  uVar9 = uVar9 ^ local_e8[1];
  uVar9 = uVar9 >> 7 | uVar9 << 0x19;
  uVar3 = uVar3 + local_88[0xb] + uVar9;
  uVar5 = uVar5 ^ uVar7;
  uVar1 = uVar1 ^ uVar3;
  uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[0] = local_e8[0] + uVar1;
  uVar9 = uVar9 ^ local_e8[0];
  uVar9 = uVar9 >> 0xc | uVar9 << 0x14;
  uVar3 = uVar3 + local_88[8] + uVar9;
  uVar1 = uVar1 ^ uVar3;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[0] = local_e8[0] + uVar1;
  uVar9 = uVar9 ^ local_e8[0];
  uVar10 = uVar9 >> 7 | uVar9 << 0x19;
  uVar9 = uVar15 >> 0x10 | uVar15 << 0x10;
  local_e8[1] = local_e8[1] + uVar9;
  uVar8 = uVar8 ^ local_e8[1];
  uVar8 = uVar8 >> 0xc | uVar8 << 0x14;
  uVar12 = uVar12 + local_88[0] + uVar8;
  uVar9 = uVar9 ^ uVar12;
  uVar13 = uVar9 >> 8 | uVar9 << 0x18;
  local_e8[1] = local_e8[1] + uVar13;
  uVar8 = uVar8 ^ local_e8[1];
  uVar8 = uVar8 >> 7 | uVar8 << 0x19;
  uVar15 = uVar16 >> 0x10 | uVar16 << 0x10;
  uVar3 = uVar3 + local_88[10] + uVar8;
  local_e8[2] = local_e8[2] + uVar15;
  uVar14 = uVar14 ^ local_e8[2];
  uVar9 = uVar14 >> 0xc | uVar14 << 0x14;
  uVar6 = uVar6 + local_88[2] + uVar9;
  uVar15 = uVar15 ^ uVar6;
  uVar16 = uVar15 >> 8 | uVar15 << 0x18;
  local_e8[2] = local_e8[2] + uVar16;
  uVar9 = uVar9 ^ local_e8[2];
  uVar9 = uVar9 >> 7 | uVar9 << 0x19;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[3] = local_e8[3] + uVar5;
  uVar12 = uVar12 + local_88[3] + uVar9;
  uVar4 = uVar4 ^ local_e8[3];
  uVar4 = uVar4 >> 0xc | uVar4 << 0x14;
  uVar7 = uVar7 + local_88[0xd] + uVar4;
  uVar1 = uVar1 ^ uVar12;
  uVar5 = uVar5 ^ uVar7;
  uVar5 = uVar5 >> 8 | uVar5 << 0x18;
  local_e8[3] = local_e8[3] + uVar5;
  uVar5 = uVar5 ^ uVar3;
  uVar4 = uVar4 ^ local_e8[3];
  uVar4 = uVar4 >> 7 | uVar4 << 0x19;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[2] = local_e8[2] + uVar5;
  uVar8 = uVar8 ^ local_e8[2];
  uVar8 = uVar8 >> 0xc | uVar8 << 0x14;
  uVar6 = uVar6 + local_88[7] + uVar4;
  uVar13 = uVar13 ^ uVar6;
  uVar3 = uVar3 + local_88[0xe] + uVar8;
  uVar5 = uVar5 ^ uVar3;
  uVar5 = uVar5 >> 8 | uVar5 << 0x18;
  local_e8[2] = local_e8[2] + uVar5;
  uVar8 = uVar8 ^ local_e8[2];
  uVar8 = uVar8 >> 7 | uVar8 << 0x19;
  uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[3] = local_e8[3] + uVar1;
  uVar9 = uVar9 ^ local_e8[3];
  uVar9 = uVar9 >> 0xc | uVar9 << 0x14;
  uVar12 = uVar12 + local_88[6] + uVar9;
  uVar1 = uVar1 ^ uVar12;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[3] = local_e8[3] + uVar1;
  uVar9 = uVar9 ^ local_e8[3];
  uVar14 = uVar9 >> 7 | uVar9 << 0x19;
  uVar9 = uVar13 >> 0x10 | uVar13 << 0x10;
  local_e8[0] = local_e8[0] + uVar9;
  uVar4 = uVar4 ^ local_e8[0];
  uVar4 = uVar4 >> 0xc | uVar4 << 0x14;
  uVar6 = uVar6 + local_88[1] + uVar4;
  uVar9 = uVar9 ^ uVar6;
  uVar15 = uVar9 >> 8 | uVar9 << 0x18;
  local_e8[0] = local_e8[0] + uVar15;
  uVar12 = uVar12 + local_88[3] + uVar8;
  uVar4 = uVar4 ^ local_e8[0];
  uVar4 = uVar4 >> 7 | uVar4 << 0x19;
  uVar15 = uVar15 ^ uVar12;
  uVar9 = uVar7 + local_88[9] + uVar10;
  uVar7 = uVar6 + local_88[0xd] + uVar14;
  uVar16 = uVar16 ^ uVar9;
  uVar13 = uVar16 >> 0x10 | uVar16 << 0x10;
  local_e8[1] = local_e8[1] + uVar13;
  uVar10 = uVar10 ^ local_e8[1];
  uVar10 = uVar10 >> 0xc | uVar10 << 0x14;
  uVar6 = uVar9 + local_88[4] + uVar10;
  uVar13 = uVar13 ^ uVar6;
  uVar16 = uVar13 >> 8 | uVar13 << 0x18;
  local_e8[1] = local_e8[1] + uVar16;
  uVar16 = uVar16 ^ uVar7;
  uVar10 = uVar10 ^ local_e8[1];
  uVar9 = uVar10 >> 7 | uVar10 << 0x19;
  uVar3 = uVar3 + local_88[7] + uVar9;
  uVar1 = uVar1 ^ uVar3;
  uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[0] = local_e8[0] + uVar1;
  uVar9 = uVar9 ^ local_e8[0];
  uVar10 = uVar9 >> 0xc | uVar9 << 0x14;
  uVar9 = uVar6 + local_88[0xb] + uVar4;
  uVar5 = uVar5 ^ uVar9;
  uVar3 = uVar3 + local_88[9] + uVar10;
  uVar1 = uVar1 ^ uVar3;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[0] = local_e8[0] + uVar1;
  uVar10 = uVar10 ^ local_e8[0];
  uVar13 = uVar10 >> 7 | uVar10 << 0x19;
  uVar10 = uVar15 >> 0x10 | uVar15 << 0x10;
  local_e8[1] = local_e8[1] + uVar10;
  uVar8 = uVar8 ^ local_e8[1];
  uVar8 = uVar8 >> 0xc | uVar8 << 0x14;
  uVar6 = uVar12 + local_88[1] + uVar8;
  uVar10 = uVar10 ^ uVar6;
  uVar15 = uVar10 >> 8 | uVar10 << 0x18;
  local_e8[1] = local_e8[1] + uVar15;
  uVar8 = uVar8 ^ local_e8[1];
  uVar8 = uVar8 >> 7 | uVar8 << 0x19;
  uVar16 = uVar16 >> 0x10 | uVar16 << 0x10;
  uVar3 = uVar3 + local_88[2] + uVar8;
  local_e8[2] = local_e8[2] + uVar16;
  uVar14 = uVar14 ^ local_e8[2];
  uVar10 = uVar14 >> 0xc | uVar14 << 0x14;
  uVar12 = uVar7 + local_88[0xc] + uVar10;
  uVar16 = uVar16 ^ uVar12;
  uVar16 = uVar16 >> 8 | uVar16 << 0x18;
  local_e8[2] = local_e8[2] + uVar16;
  uVar10 = uVar10 ^ local_e8[2];
  uVar7 = uVar10 >> 7 | uVar10 << 0x19;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[3] = local_e8[3] + uVar5;
  uVar4 = uVar4 ^ local_e8[3];
  uVar4 = uVar4 >> 0xc | uVar4 << 0x14;
  uVar10 = uVar9 + local_88[0xe] + uVar4;
  uVar5 = uVar5 ^ uVar10;
  uVar5 = uVar5 >> 8 | uVar5 << 0x18;
  local_e8[3] = local_e8[3] + uVar5;
  uVar5 = uVar5 ^ uVar3;
  uVar4 = uVar4 ^ local_e8[3];
  uVar4 = uVar4 >> 7 | uVar4 << 0x19;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[2] = local_e8[2] + uVar5;
  uVar9 = uVar12 + local_88[4] + uVar4;
  uVar8 = uVar8 ^ local_e8[2];
  uVar12 = uVar8 >> 0xc | uVar8 << 0x14;
  uVar15 = uVar15 ^ uVar9;
  uVar3 = uVar3 + local_88[6] + uVar12;
  uVar5 = uVar5 ^ uVar3;
  uVar8 = uVar5 >> 8 | uVar5 << 0x18;
  local_e8[2] = local_e8[2] + uVar8;
  uVar12 = uVar12 ^ local_e8[2];
  uVar12 = uVar12 >> 7 | uVar12 << 0x19;
  uVar5 = uVar6 + local_88[5] + uVar7;
  uVar1 = uVar1 ^ uVar5;
  uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[3] = local_e8[3] + uVar1;
  uVar7 = uVar7 ^ local_e8[3];
  uVar6 = uVar7 >> 0xc | uVar7 << 0x14;
  uVar5 = uVar5 + local_88[10] + uVar6;
  uVar1 = uVar1 ^ uVar5;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  uVar7 = uVar5 + local_88[5] + uVar12;
  local_e8[3] = local_e8[3] + uVar1;
  uVar6 = uVar6 ^ local_e8[3];
  uVar14 = uVar6 >> 7 | uVar6 << 0x19;
  uVar5 = uVar15 >> 0x10 | uVar15 << 0x10;
  local_e8[0] = local_e8[0] + uVar5;
  uVar4 = uVar4 ^ local_e8[0];
  uVar4 = uVar4 >> 0xc | uVar4 << 0x14;
  uVar6 = uVar9 + local_88[0] + uVar4;
  uVar5 = uVar5 ^ uVar6;
  uVar15 = uVar5 >> 8 | uVar5 << 0x18;
  local_e8[0] = local_e8[0] + uVar15;
  uVar15 = uVar15 ^ uVar7;
  uVar4 = uVar4 ^ local_e8[0];
  uVar5 = uVar4 >> 7 | uVar4 << 0x19;
  uVar4 = uVar10 + local_88[0xf] + uVar13;
  uVar9 = uVar6 + local_88[2] + uVar14;
  uVar16 = uVar16 ^ uVar4;
  uVar10 = uVar16 >> 0x10 | uVar16 << 0x10;
  local_e8[1] = local_e8[1] + uVar10;
  uVar13 = uVar13 ^ local_e8[1];
  uVar6 = uVar13 >> 0xc | uVar13 << 0x14;
  uVar4 = uVar4 + local_88[8] + uVar6;
  uVar10 = uVar10 ^ uVar4;
  uVar16 = uVar10 >> 8 | uVar10 << 0x18;
  local_e8[1] = local_e8[1] + uVar16;
  uVar10 = uVar4 + local_88[10] + uVar5;
  uVar16 = uVar16 ^ uVar9;
  uVar6 = uVar6 ^ local_e8[1];
  uVar4 = uVar6 >> 7 | uVar6 << 0x19;
  uVar3 = uVar3 + local_88[9] + uVar4;
  uVar8 = uVar8 ^ uVar10;
  uVar1 = uVar1 ^ uVar3;
  uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[0] = local_e8[0] + uVar1;
  uVar4 = uVar4 ^ local_e8[0];
  uVar6 = uVar4 >> 0xc | uVar4 << 0x14;
  uVar3 = uVar3 + local_88[0] + uVar6;
  uVar1 = uVar1 ^ uVar3;
  uVar4 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[0] = local_e8[0] + uVar4;
  uVar6 = uVar6 ^ local_e8[0];
  uVar6 = uVar6 >> 7 | uVar6 << 0x19;
  uVar13 = uVar15 >> 0x10 | uVar15 << 0x10;
  local_e8[1] = local_e8[1] + uVar13;
  uVar12 = uVar12 ^ local_e8[1];
  uVar1 = uVar12 >> 0xc | uVar12 << 0x14;
  uVar12 = uVar7 + local_88[7] + uVar1;
  uVar13 = uVar13 ^ uVar12;
  uVar15 = uVar13 >> 8 | uVar13 << 0x18;
  local_e8[1] = local_e8[1] + uVar15;
  uVar1 = uVar1 ^ local_e8[1];
  uVar1 = uVar1 >> 7 | uVar1 << 0x19;
  uVar16 = uVar16 >> 0x10 | uVar16 << 0x10;
  local_e8[2] = local_e8[2] + uVar16;
  uVar14 = uVar14 ^ local_e8[2];
  uVar13 = uVar14 >> 0xc | uVar14 << 0x14;
  uVar7 = uVar9 + local_88[4] + uVar13;
  uVar16 = uVar16 ^ uVar7;
  uVar16 = uVar16 >> 8 | uVar16 << 0x18;
  local_e8[2] = local_e8[2] + uVar16;
  uVar13 = uVar13 ^ local_e8[2];
  uVar14 = uVar13 >> 7 | uVar13 << 0x19;
  uVar8 = uVar8 >> 0x10 | uVar8 << 0x10;
  uVar9 = uVar12 + local_88[0xb] + uVar14;
  uVar4 = uVar4 ^ uVar9;
  local_e8[3] = local_e8[3] + uVar8;
  uVar5 = uVar5 ^ local_e8[3];
  uVar5 = uVar5 >> 0xc | uVar5 << 0x14;
  uVar13 = uVar10 + local_88[0xf] + uVar5;
  uVar8 = uVar8 ^ uVar13;
  uVar8 = uVar8 >> 8 | uVar8 << 0x18;
  local_e8[3] = local_e8[3] + uVar8;
  uVar5 = uVar5 ^ local_e8[3];
  uVar5 = uVar5 >> 7 | uVar5 << 0x19;
  uVar10 = uVar7 + local_88[6] + uVar5;
  uVar15 = uVar15 ^ uVar10;
  uVar12 = uVar3 + local_88[0xe] + uVar1;
  uVar8 = uVar8 ^ uVar12;
  uVar3 = uVar8 >> 0x10 | uVar8 << 0x10;
  local_e8[2] = local_e8[2] + uVar3;
  uVar1 = uVar1 ^ local_e8[2];
  uVar1 = uVar1 >> 0xc | uVar1 << 0x14;
  uVar7 = uVar12 + local_88[1] + uVar1;
  uVar3 = uVar3 ^ uVar7;
  uVar3 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[2] = local_e8[2] + uVar3;
  uVar1 = uVar1 ^ local_e8[2];
  uVar12 = uVar1 >> 7 | uVar1 << 0x19;
  uVar1 = uVar4 >> 0x10 | uVar4 << 0x10;
  local_e8[3] = local_e8[3] + uVar1;
  uVar14 = uVar14 ^ local_e8[3];
  uVar8 = uVar14 >> 0xc | uVar14 << 0x14;
  uVar4 = uVar9 + local_88[0xc] + uVar8;
  uVar1 = uVar1 ^ uVar4;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[3] = local_e8[3] + uVar1;
  uVar8 = uVar8 ^ local_e8[3];
  uVar14 = uVar8 >> 7 | uVar8 << 0x19;
  uVar8 = uVar15 >> 0x10 | uVar15 << 0x10;
  uVar9 = uVar4 + local_88[6] + uVar12;
  local_e8[0] = local_e8[0] + uVar8;
  uVar13 = uVar13 + local_88[3] + uVar6;
  uVar5 = uVar5 ^ local_e8[0];
  uVar4 = uVar5 >> 0xc | uVar5 << 0x14;
  uVar5 = uVar10 + local_88[8] + uVar4;
  uVar16 = uVar16 ^ uVar13;
  uVar8 = uVar8 ^ uVar5;
  uVar15 = uVar8 >> 8 | uVar8 << 0x18;
  local_e8[0] = local_e8[0] + uVar15;
  uVar15 = uVar15 ^ uVar9;
  uVar4 = uVar4 ^ local_e8[0];
  uVar8 = uVar4 >> 7 | uVar4 << 0x19;
  uVar16 = uVar16 >> 0x10 | uVar16 << 0x10;
  uVar10 = uVar5 + local_88[0] + uVar14;
  local_e8[1] = local_e8[1] + uVar16;
  uVar6 = uVar6 ^ local_e8[1];
  uVar4 = uVar6 >> 0xc | uVar6 << 0x14;
  uVar5 = uVar13 + local_88[0xd] + uVar4;
  uVar16 = uVar16 ^ uVar5;
  uVar17 = uVar16 >> 8 | uVar16 << 0x18;
  local_e8[1] = local_e8[1] + uVar17;
  uVar17 = uVar17 ^ uVar10;
  uVar4 = uVar4 ^ local_e8[1];
  uVar6 = uVar4 >> 7 | uVar4 << 0x19;
  uVar13 = uVar5 + local_88[8] + uVar8;
  uVar5 = uVar7 + local_88[2] + uVar6;
  uVar3 = uVar3 ^ uVar13;
  uVar1 = uVar1 ^ uVar5;
  uVar4 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[0] = local_e8[0] + uVar4;
  uVar6 = uVar6 ^ local_e8[0];
  uVar6 = uVar6 >> 0xc | uVar6 << 0x14;
  uVar1 = uVar5 + local_88[0xc] + uVar6;
  uVar4 = uVar4 ^ uVar1;
  uVar4 = uVar4 >> 8 | uVar4 << 0x18;
  local_e8[0] = local_e8[0] + uVar4;
  uVar6 = uVar6 ^ local_e8[0];
  uVar7 = uVar6 >> 7 | uVar6 << 0x19;
  uVar15 = uVar15 >> 0x10 | uVar15 << 0x10;
  local_e8[1] = local_e8[1] + uVar15;
  uVar12 = uVar12 ^ local_e8[1];
  uVar5 = uVar12 >> 0xc | uVar12 << 0x14;
  uVar6 = uVar9 + local_88[10] + uVar5;
  uVar15 = uVar15 ^ uVar6;
  uVar16 = uVar15 >> 8 | uVar15 << 0x18;
  local_e8[1] = local_e8[1] + uVar16;
  uVar5 = uVar5 ^ local_e8[1];
  uVar12 = uVar5 >> 7 | uVar5 << 0x19;
  uVar9 = uVar17 >> 0x10 | uVar17 << 0x10;
  uVar1 = uVar1 + local_88[4] + uVar12;
  local_e8[2] = local_e8[2] + uVar9;
  uVar14 = uVar14 ^ local_e8[2];
  uVar5 = uVar14 >> 0xc | uVar14 << 0x14;
  uVar10 = uVar10 + local_88[0xb] + uVar5;
  uVar9 = uVar9 ^ uVar10;
  uVar17 = uVar9 >> 8 | uVar9 << 0x18;
  local_e8[2] = local_e8[2] + uVar17;
  uVar5 = uVar5 ^ local_e8[2];
  uVar14 = uVar5 >> 7 | uVar5 << 0x19;
  uVar5 = uVar3 >> 0x10 | uVar3 << 0x10;
  uVar9 = uVar6 + uVar14 + local_88[7];
  local_e8[3] = local_e8[3] + uVar5;
  uVar8 = uVar8 ^ local_e8[3];
  uVar3 = uVar8 >> 0xc | uVar8 << 0x14;
  uVar6 = uVar13 + local_88[3] + uVar3;
  uVar4 = uVar4 ^ uVar9;
  uVar5 = uVar5 ^ uVar6;
  uVar5 = uVar5 >> 8 | uVar5 << 0x18;
  local_e8[3] = local_e8[3] + uVar5;
  uVar5 = uVar5 ^ uVar1;
  uVar3 = uVar3 ^ local_e8[3];
  uVar8 = uVar3 >> 7 | uVar3 << 0x19;
  uVar3 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[2] = local_e8[2] + uVar3;
  uVar12 = uVar12 ^ local_e8[2];
  uVar12 = uVar12 >> 0xc | uVar12 << 0x14;
  uVar1 = uVar1 + local_88[0xd] + uVar12;
  uVar13 = uVar6 + local_88[1] + uVar7;
  uVar3 = uVar3 ^ uVar1;
  uVar5 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[2] = uVar5 + local_e8[2];
  uVar17 = uVar17 ^ uVar13;
  uVar12 = uVar12 ^ local_e8[2];
  uVar6 = uVar12 >> 7 | uVar12 << 0x19;
  uVar3 = uVar4 >> 0x10 | uVar4 << 0x10;
  local_e8[3] = local_e8[3] + uVar3;
  uVar14 = uVar14 ^ local_e8[3];
  uVar4 = uVar14 >> 0xc | uVar14 << 0x14;
  uVar9 = uVar9 + local_88[5] + uVar4;
  uVar3 = uVar3 ^ uVar9;
  uVar3 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[3] = local_e8[3] + uVar3;
  uVar4 = local_e8[3] ^ uVar4;
  uVar15 = uVar4 >> 7 | uVar4 << 0x19;
  uVar12 = uVar10 + local_88[0xf] + uVar8;
  uVar16 = uVar16 ^ uVar12;
  uVar10 = uVar16 >> 0x10 | uVar16 << 0x10;
  local_e8[0] = local_e8[0] + uVar10;
  uVar8 = uVar8 ^ local_e8[0];
  uVar4 = uVar8 >> 0xc | uVar8 << 0x14;
  uVar8 = uVar12 + local_88[0xe] + uVar4;
  uVar10 = uVar10 ^ uVar8;
  uVar16 = uVar10 >> 8 | uVar10 << 0x18;
  local_e8[0] = local_e8[0] + uVar16;
  uVar10 = uVar8 + uVar15 + local_88[0xe];
  uVar4 = uVar4 ^ local_e8[0];
  uVar12 = uVar4 >> 7 | uVar4 << 0x19;
  uVar14 = uVar17 >> 0x10 | uVar17 << 0x10;
  local_e8[1] = local_e8[1] + uVar14;
  uVar7 = uVar7 ^ local_e8[1];
  uVar4 = uVar7 >> 0xc | uVar7 << 0x14;
  uVar8 = uVar13 + uVar4 + local_88[9];
  uVar14 = uVar14 ^ uVar8;
  uVar13 = uVar14 >> 8 | uVar14 << 0x18;
  local_e8[1] = local_e8[1] + uVar13;
  uVar13 = uVar13 ^ uVar10;
  uVar14 = uVar8 + uVar12 + local_88[4];
  uVar4 = uVar4 ^ local_e8[1];
  uVar8 = uVar4 >> 7 | uVar4 << 0x19;
  uVar4 = uVar1 + uVar8 + local_88[0xc];
  uVar3 = uVar3 ^ uVar4;
  uVar1 = uVar3 >> 0x10 | uVar3 << 0x10;
  local_e8[0] = local_e8[0] + uVar1;
  uVar8 = uVar8 ^ local_e8[0];
  uVar3 = uVar8 >> 0xc | uVar8 << 0x14;
  uVar8 = uVar4 + local_88[5] + uVar3;
  uVar7 = uVar9 + uVar6 + local_88[1];
  uVar1 = uVar1 ^ uVar8;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[0] = uVar1 + local_e8[0];
  uVar3 = local_e8[0] ^ uVar3;
  uVar4 = uVar3 >> 7 | uVar3 << 0x19;
  uVar16 = uVar16 ^ uVar7;
  uVar3 = uVar16 >> 0x10 | uVar16 << 0x10;
  local_e8[1] = local_e8[1] + uVar3;
  uVar6 = uVar6 ^ local_e8[1];
  uVar6 = uVar6 >> 0xc | uVar6 << 0x14;
  uVar7 = uVar7 + local_88[0xf] + uVar6;
  uVar3 = uVar3 ^ uVar7;
  uVar3 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[1] = uVar3 + local_e8[1];
  uVar6 = local_e8[1] ^ uVar6;
  uVar17 = uVar6 >> 7 | uVar6 << 0x19;
  uVar6 = uVar13 >> 0x10 | uVar13 << 0x10;
  uVar8 = uVar8 + uVar17 + local_88[0];
  local_e8[2] = local_e8[2] + uVar6;
  uVar15 = uVar15 ^ local_e8[2];
  uVar9 = uVar15 >> 0xc | uVar15 << 0x14;
  uVar13 = uVar10 + uVar9 + local_88[0xd];
  uVar6 = uVar6 ^ uVar13;
  uVar6 = uVar6 >> 8 | uVar6 << 0x18;
  local_e8[2] = uVar6 + local_e8[2];
  uVar9 = uVar9 ^ local_e8[2];
  uVar16 = uVar9 >> 7 | uVar9 << 0x19;
  uVar10 = uVar7 + uVar16 + local_88[6];
  uVar5 = uVar5 ^ uVar14;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[3] = local_e8[3] + uVar5;
  uVar12 = uVar12 ^ local_e8[3];
  uVar12 = uVar12 >> 0xc | uVar12 << 0x14;
  uVar15 = uVar14 + uVar12 + local_88[10];
  uVar5 = uVar5 ^ uVar15;
  uVar5 = uVar5 >> 8 | uVar5 << 0x18;
  local_e8[3] = local_e8[3] + uVar5;
  uVar5 = uVar5 ^ uVar8;
  uVar12 = uVar12 ^ local_e8[3];
  uVar9 = uVar12 >> 7 | uVar12 << 0x19;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[2] = local_e8[2] + uVar5;
  uVar14 = uVar13 + uVar9 + local_88[9];
  uVar17 = uVar17 ^ local_e8[2];
  uVar12 = uVar17 >> 0xc | uVar17 << 0x14;
  uVar7 = uVar8 + uVar12 + local_88[7];
  uVar5 = uVar5 ^ uVar7;
  uVar8 = uVar5 >> 8 | uVar5 << 0x18;
  local_e8[2] = uVar8 + local_e8[2];
  uVar12 = local_e8[2] ^ uVar12;
  uVar5 = uVar12 >> 7 | uVar12 << 0x19;
  uVar1 = uVar1 ^ uVar10;
  uVar12 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[3] = local_e8[3] + uVar12;
  uVar16 = uVar16 ^ local_e8[3];
  uVar1 = uVar16 >> 0xc | uVar16 << 0x14;
  uVar13 = uVar10 + uVar1 + local_88[3];
  uVar12 = uVar12 ^ uVar13;
  uVar10 = uVar12 >> 8 | uVar12 << 0x18;
  local_e8[3] = local_e8[3] + uVar10;
  uVar1 = local_e8[3] ^ uVar1;
  uVar1 = uVar1 >> 7 | uVar1 << 0x19;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 >> 0x10 | uVar3 << 0x10;
  local_e8[0] = local_e8[0] + uVar3;
  uVar9 = uVar9 ^ local_e8[0];
  uVar12 = uVar9 >> 0xc | uVar9 << 0x14;
  uVar14 = uVar14 + uVar12 + local_88[2];
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[0] = local_e8[0] + uVar3;
  uVar12 = uVar12 ^ local_e8[0];
  uVar9 = uVar12 >> 7 | uVar12 << 0x19;
  uVar15 = uVar15 + uVar4 + local_88[8];
  uVar6 = uVar6 ^ uVar15;
  uVar12 = uVar6 >> 0x10 | uVar6 << 0x10;
  local_e8[1] = local_e8[1] + uVar12;
  uVar4 = uVar4 ^ local_e8[1];
  uVar4 = uVar4 >> 0xc | uVar4 << 0x14;
  uVar16 = uVar15 + local_88[0xb] + uVar4;
  uVar12 = uVar12 ^ uVar16;
  uVar12 = uVar12 >> 8 | uVar12 << 0x18;
  local_e8[1] = local_e8[1] + uVar12;
  uVar4 = uVar4 ^ local_e8[1];
  uVar6 = uVar4 >> 7 | uVar4 << 0x19;
  uVar4 = uVar7 + uVar6 + local_88[0xd];
  uVar10 = uVar10 ^ uVar4;
  uVar10 = uVar10 >> 0x10 | uVar10 << 0x10;
  local_e8[0] = local_e8[0] + uVar10;
  uVar6 = uVar6 ^ local_e8[0];
  uVar7 = uVar6 >> 0xc | uVar6 << 0x14;
  uVar6 = uVar4 + local_88[0xb] + uVar7;
  uVar10 = uVar10 ^ uVar6;
  uVar10 = uVar10 >> 8 | uVar10 << 0x18;
  local_e8[0] = uVar10 + local_e8[0];
  uVar7 = local_e8[0] ^ uVar7;
  uVar7 = uVar7 >> 7 | uVar7 << 0x19;
  uVar13 = uVar13 + uVar5 + local_88[7];
  uVar3 = uVar3 ^ uVar13;
  uVar3 = uVar3 >> 0x10 | uVar3 << 0x10;
  local_e8[1] = local_e8[1] + uVar3;
  uVar5 = uVar5 ^ local_e8[1];
  uVar4 = uVar5 >> 0xc | uVar5 << 0x14;
  uVar15 = uVar13 + uVar4 + local_88[0xe];
  uVar3 = uVar3 ^ uVar15;
  uVar5 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[1] = uVar5 + local_e8[1];
  uVar4 = local_e8[1] ^ uVar4;
  uVar3 = uVar4 >> 7 | uVar4 << 0x19;
  uVar6 = uVar6 + uVar3 + local_88[5];
  uVar13 = uVar14 + uVar1 + local_88[0xc];
  uVar12 = uVar12 ^ uVar13;
  uVar4 = uVar12 >> 0x10 | uVar12 << 0x10;
  local_e8[2] = local_e8[2] + uVar4;
  uVar1 = uVar1 ^ local_e8[2];
  uVar1 = uVar1 >> 0xc | uVar1 << 0x14;
  uVar13 = uVar13 + uVar1 + local_88[1];
  uVar4 = uVar4 ^ uVar13;
  uVar4 = uVar4 >> 8 | uVar4 << 0x18;
  local_e8[2] = uVar4 + local_e8[2];
  uVar1 = uVar1 ^ local_e8[2];
  uVar12 = uVar1 >> 7 | uVar1 << 0x19;
  uVar14 = uVar16 + uVar9 + local_88[3];
  uVar8 = uVar8 ^ uVar14;
  uVar1 = uVar8 >> 0x10 | uVar8 << 0x10;
  local_e8[3] = local_e8[3] + uVar1;
  uVar9 = uVar9 ^ local_e8[3];
  uVar8 = uVar9 >> 0xc | uVar9 << 0x14;
  uVar11 = uVar14 + uVar8 + local_88[9];
  uVar1 = uVar1 ^ uVar11;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[3] = local_e8[3] + uVar1;
  uVar1 = uVar1 ^ uVar6;
  uVar8 = uVar8 ^ local_e8[3];
  uVar14 = uVar8 >> 7 | uVar8 << 0x19;
  uVar9 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[2] = local_e8[2] + uVar9;
  uVar17 = uVar13 + uVar14 + local_88[8];
  uVar3 = uVar3 ^ local_e8[2];
  uVar1 = uVar3 >> 0xc | uVar3 << 0x14;
  uVar8 = uVar6 + uVar1 + local_88[0];
  uVar9 = uVar9 ^ uVar8;
  uVar6 = uVar9 >> 8 | uVar9 << 0x18;
  local_e8[2] = uVar6 + local_e8[2];
  uVar1 = local_e8[2] ^ uVar1;
  uVar13 = uVar1 >> 7 | uVar1 << 0x19;
  uVar9 = uVar15 + local_88[0xf] + uVar12;
  uVar10 = uVar10 ^ uVar9;
  uVar3 = uVar10 >> 0x10 | uVar10 << 0x10;
  local_e8[3] = local_e8[3] + uVar3;
  uVar12 = uVar12 ^ local_e8[3];
  uVar1 = uVar12 >> 0xc | uVar12 << 0x14;
  uVar16 = uVar9 + uVar1 + local_88[4];
  uVar3 = uVar3 ^ uVar16;
  uVar12 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[3] = local_e8[3] + uVar12;
  uVar1 = local_e8[3] ^ uVar1;
  uVar15 = uVar1 >> 7 | uVar1 << 0x19;
  uVar5 = uVar5 ^ uVar17;
  uVar1 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[0] = local_e8[0] + uVar1;
  uVar14 = uVar14 ^ local_e8[0];
  uVar3 = uVar14 >> 0xc | uVar14 << 0x14;
  uVar14 = uVar17 + local_88[6] + uVar3;
  uVar1 = uVar1 ^ uVar14;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[0] = local_e8[0] + uVar1;
  uVar3 = uVar3 ^ local_e8[0];
  uVar10 = uVar3 >> 7 | uVar3 << 0x19;
  uVar5 = uVar11 + uVar7 + local_88[2];
  uVar4 = uVar4 ^ uVar5;
  uVar3 = uVar4 >> 0x10 | uVar4 << 0x10;
  local_e8[1] = local_e8[1] + uVar3;
  uVar7 = uVar7 ^ local_e8[1];
  uVar4 = uVar7 >> 0xc | uVar7 << 0x14;
  uVar17 = uVar5 + uVar4 + local_88[10];
  uVar3 = uVar3 ^ uVar17;
  uVar5 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[1] = local_e8[1] + uVar5;
  uVar4 = uVar4 ^ local_e8[1];
  uVar7 = uVar4 >> 7 | uVar4 << 0x19;
  uVar3 = uVar8 + local_88[6] + uVar7;
  uVar12 = uVar12 ^ uVar3;
  uVar4 = uVar12 >> 0x10 | uVar12 << 0x10;
  local_e8[0] = local_e8[0] + uVar4;
  uVar7 = uVar7 ^ local_e8[0];
  uVar7 = uVar7 >> 0xc | uVar7 << 0x14;
  uVar8 = uVar3 + local_88[0xf] + uVar7;
  uVar4 = uVar4 ^ uVar8;
  uVar12 = uVar4 >> 8 | uVar4 << 0x18;
  local_e8[0] = uVar12 + local_e8[0];
  uVar7 = local_e8[0] ^ uVar7;
  uVar9 = uVar7 >> 7 | uVar7 << 0x19;
  uVar4 = uVar16 + uVar13 + local_88[0xe];
  uVar1 = uVar1 ^ uVar4;
  uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[1] = local_e8[1] + uVar1;
  uVar13 = uVar13 ^ local_e8[1];
  uVar3 = uVar13 >> 0xc | uVar13 << 0x14;
  uVar7 = uVar4 + uVar3 + local_88[9];
  uVar1 = uVar1 ^ uVar7;
  uVar4 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[1] = uVar4 + local_e8[1];
  uVar3 = local_e8[1] ^ uVar3;
  uVar1 = uVar3 >> 7 | uVar3 << 0x19;
  uVar8 = uVar8 + uVar1 + local_88[0xc];
  uVar13 = uVar14 + uVar15 + local_88[0xb];
  uVar5 = uVar5 ^ uVar13;
  uVar3 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[2] = local_e8[2] + uVar3;
  uVar15 = uVar15 ^ local_e8[2];
  uVar5 = uVar15 >> 0xc | uVar15 << 0x14;
  uVar13 = uVar13 + uVar5 + local_88[3];
  uVar3 = uVar3 ^ uVar13;
  uVar3 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[2] = uVar3 + local_e8[2];
  uVar5 = uVar5 ^ local_e8[2];
  uVar14 = uVar5 >> 7 | uVar5 << 0x19;
  uVar15 = uVar7 + uVar14 + local_88[0xd];
  uVar7 = uVar17 + uVar10 + local_88[0];
  uVar6 = uVar6 ^ uVar7;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x10;
  local_e8[3] = local_e8[3] + uVar6;
  uVar10 = uVar10 ^ local_e8[3];
  uVar5 = uVar10 >> 0xc | uVar10 << 0x14;
  uVar17 = uVar7 + uVar5 + local_88[8];
  uVar6 = uVar6 ^ uVar17;
  uVar6 = uVar6 >> 8 | uVar6 << 0x18;
  local_e8[3] = local_e8[3] + uVar6;
  uVar6 = uVar6 ^ uVar8;
  uVar5 = uVar5 ^ local_e8[3];
  uVar10 = uVar5 >> 7 | uVar5 << 0x19;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x10;
  local_e8[2] = local_e8[2] + uVar6;
  uVar16 = uVar13 + uVar10 + local_88[1];
  uVar1 = uVar1 ^ local_e8[2];
  uVar1 = uVar1 >> 0xc | uVar1 << 0x14;
  uVar5 = uVar8 + uVar1 + local_88[2];
  uVar6 = uVar6 ^ uVar5;
  uVar7 = uVar6 >> 8 | uVar6 << 0x18;
  local_e8[2] = uVar7 + local_e8[2];
  uVar1 = local_e8[2] ^ uVar1;
  uVar13 = uVar1 >> 7 | uVar1 << 0x19;
  uVar12 = uVar12 ^ uVar15;
  uVar8 = uVar12 >> 0x10 | uVar12 << 0x10;
  local_e8[3] = local_e8[3] + uVar8;
  uVar14 = uVar14 ^ local_e8[3];
  uVar1 = uVar14 >> 0xc | uVar14 << 0x14;
  uVar14 = uVar15 + uVar1 + local_88[7];
  uVar8 = uVar8 ^ uVar14;
  uVar8 = uVar8 >> 8 | uVar8 << 0x18;
  local_e8[3] = local_e8[3] + uVar8;
  uVar1 = local_e8[3] ^ uVar1;
  uVar6 = uVar1 >> 7 | uVar1 << 0x19;
  uVar4 = uVar4 ^ uVar16;
  uVar1 = uVar4 >> 0x10 | uVar4 << 0x10;
  local_e8[0] = local_e8[0] + uVar1;
  uVar10 = uVar10 ^ local_e8[0];
  uVar4 = uVar10 >> 0xc | uVar10 << 0x14;
  uVar15 = uVar16 + local_88[4] + uVar4;
  uVar1 = uVar1 ^ uVar15;
  uVar1 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[0] = local_e8[0] + uVar1;
  uVar4 = uVar4 ^ local_e8[0];
  uVar10 = uVar4 >> 7 | uVar4 << 0x19;
  uVar4 = uVar17 + uVar9 + local_88[10];
  uVar3 = uVar3 ^ uVar4;
  uVar3 = uVar3 >> 0x10 | uVar3 << 0x10;
  local_e8[1] = local_e8[1] + uVar3;
  uVar9 = uVar9 ^ local_e8[1];
  uVar12 = uVar9 >> 0xc | uVar9 << 0x14;
  uVar16 = uVar4 + uVar12 + local_88[5];
  uVar3 = uVar3 ^ uVar16;
  uVar9 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[1] = local_e8[1] + uVar9;
  uVar12 = uVar12 ^ local_e8[1];
  uVar4 = uVar12 >> 7 | uVar12 << 0x19;
  uVar5 = local_88[10] + uVar4 + uVar5;
  uVar8 = uVar8 ^ uVar5;
  uVar3 = uVar8 >> 0x10 | uVar8 << 0x10;
  local_e8[0] = local_e8[0] + uVar3;
  uVar4 = uVar4 ^ local_e8[0];
  uVar8 = uVar4 >> 0xc | uVar4 << 0x14;
  uVar12 = uVar5 + uVar8 + local_88[2];
  uVar3 = uVar3 ^ uVar12;
  uVar4 = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[0] = uVar4 + local_e8[0];
  uVar8 = local_e8[0] ^ uVar8;
  uVar8 = uVar8 >> 7 | uVar8 << 0x19;
  uVar5 = uVar14 + uVar13 + local_88[8];
  uVar1 = uVar1 ^ uVar5;
  uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
  local_e8[1] = local_e8[1] + uVar1;
  uVar13 = uVar13 ^ local_e8[1];
  uVar3 = uVar13 >> 0xc | uVar13 << 0x14;
  uVar13 = uVar5 + local_88[4] + uVar3;
  uVar1 = uVar1 ^ uVar13;
  uVar5 = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[1] = uVar5 + local_e8[1];
  uVar3 = local_e8[1] ^ uVar3;
  uVar1 = uVar3 >> 7 | uVar3 << 0x19;
  uVar3 = uVar12 + uVar1 + local_88[0xf];
  uVar14 = uVar15 + uVar6 + local_88[7];
  uVar9 = uVar9 ^ uVar14;
  uVar12 = uVar9 >> 0x10 | uVar9 << 0x10;
  local_e8[2] = local_e8[2] + uVar12;
  uVar6 = uVar6 ^ local_e8[2];
  uVar9 = uVar6 >> 0xc | uVar6 << 0x14;
  uVar14 = uVar14 + uVar9 + local_88[6];
  uVar12 = uVar12 ^ uVar14;
  uVar6 = uVar12 >> 8 | uVar12 << 0x18;
  local_e8[2] = uVar6 + local_e8[2];
  uVar9 = uVar9 ^ local_e8[2];
  uVar9 = uVar9 >> 7 | uVar9 << 0x19;
  uVar13 = uVar13 + uVar9 + local_88[9];
  uVar15 = uVar16 + uVar10 + local_88[1];
  uVar7 = uVar7 ^ uVar15;
  uVar12 = uVar7 >> 0x10 | uVar7 << 0x10;
  local_e8[3] = local_e8[3] + uVar12;
  uVar10 = uVar10 ^ local_e8[3];
  uVar7 = uVar10 >> 0xc | uVar10 << 0x14;
  uVar15 = uVar15 + uVar7 + local_88[5];
  uVar12 = uVar12 ^ uVar15;
  uVar12 = uVar12 >> 8 | uVar12 << 0x18;
  local_e8[3] = local_e8[3] + uVar12;
  uVar12 = uVar12 ^ uVar3;
  uVar7 = uVar7 ^ local_e8[3];
  uVar7 = uVar7 >> 7 | uVar7 << 0x19;
  uVar12 = uVar12 >> 0x10 | uVar12 << 0x10;
  local_e8[2] = local_e8[2] + uVar12;
  uVar10 = uVar14 + uVar7 + local_88[3];
  uVar1 = uVar1 ^ local_e8[2];
  uVar1 = uVar1 >> 0xc | uVar1 << 0x14;
  local_108[0] = uVar3 + uVar1 + local_88[0xb];
  uVar12 = local_108[0] ^ uVar12;
  local_e8[7] = uVar12 >> 8 | uVar12 << 0x18;
  local_e8[2] = local_e8[7] + local_e8[2];
  local_e8[2] = local_e8[2] ^ uVar1;
  local_108[5] = local_e8[2] >> 7 | local_e8[2] << 0x19;
  uVar4 = uVar4 ^ uVar13;
  uVar1 = uVar4 >> 0x10 | uVar4 << 0x10;
  local_e8[3] = local_e8[3] + uVar1;
  uVar9 = uVar9 ^ local_e8[3];
  uVar3 = uVar9 >> 0xc | uVar9 << 0x14;
  local_108[1] = uVar13 + uVar3 + local_88[0xe];
  uVar1 = local_108[1] ^ uVar1;
  local_e8[4] = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[3] = local_e8[4] + local_e8[3];
  local_e8[3] = local_e8[3] ^ uVar3;
  local_108[6] = local_e8[3] >> 7 | local_e8[3] << 0x19;
  uVar5 = uVar5 ^ uVar10;
  uVar1 = uVar5 >> 0x10 | uVar5 << 0x10;
  local_e8[0] = local_e8[0] + uVar1;
  uVar7 = uVar7 ^ local_e8[0];
  uVar3 = uVar7 >> 0xc | uVar7 << 0x14;
  local_108[2] = uVar10 + uVar3 + local_88[0xc];
  uVar1 = local_108[2] ^ uVar1;
  local_e8[5] = uVar1 >> 8 | uVar1 << 0x18;
  local_e8[0] = local_e8[5] + local_e8[0];
  local_e8[0] = local_e8[0] ^ uVar3;
  local_108[7] = local_e8[0] >> 7 | local_e8[0] << 0x19;
  uVar4 = uVar15 + uVar8 + local_88[0xd];
  uVar6 = uVar6 ^ uVar4;
  uVar3 = uVar6 >> 0x10 | uVar6 << 0x10;
  local_e8[1] = local_e8[1] + uVar3;
  uVar8 = uVar8 ^ local_e8[1];
  uVar1 = uVar8 >> 0xc | uVar8 << 0x14;
  local_108[3] = uVar4 + uVar1 + local_88[0];
  uVar3 = local_108[3] ^ uVar3;
  local_e8[6] = uVar3 >> 8 | uVar3 << 0x18;
  local_e8[1] = local_e8[6] + local_e8[1];
  local_e8[1] = local_e8[1] ^ uVar1;
  local_108[4] = local_e8[1] >> 7 | local_e8[1] << 0x19;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    *(uint *)((long)md + lVar2 * 4) =
         local_108[lVar2] ^ *(uint *)((long)md + lVar2 * 4) ^ local_e8[lVar2];
  }
  return 8;
}

Assistant:

static int blake2s_compress(hash_state *md, const unsigned char *buf)
#endif
{
   unsigned long i;
   ulong32 m[16];
   ulong32 v[16];

   for (i = 0; i < 16; ++i) {
      LOAD32L(m[i], buf + i * sizeof(m[i]));
   }

   for (i = 0; i < 8; ++i)
      v[i] = md->blake2s.h[i];

   v[8] = blake2s_IV[0];
   v[9] = blake2s_IV[1];
   v[10] = blake2s_IV[2];
   v[11] = blake2s_IV[3];
   v[12] = md->blake2s.t[0] ^ blake2s_IV[4];
   v[13] = md->blake2s.t[1] ^ blake2s_IV[5];
   v[14] = md->blake2s.f[0] ^ blake2s_IV[6];
   v[15] = md->blake2s.f[1] ^ blake2s_IV[7];

   ROUND(0);
   ROUND(1);
   ROUND(2);
   ROUND(3);
   ROUND(4);
   ROUND(5);
   ROUND(6);
   ROUND(7);
   ROUND(8);
   ROUND(9);

   for (i = 0; i < 8; ++i)
      md->blake2s.h[i] = md->blake2s.h[i] ^ v[i] ^ v[i + 8];

   return CRYPT_OK;
}